

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch_and_reduce_algorithm.cpp
# Opt level: O2

int __thiscall branch_and_reduce_algorithm::max_nh_vtx(branch_and_reduce_algorithm *this)

{
  int iVar1;
  pointer pvVar2;
  pointer piVar3;
  int *piVar4;
  pointer piVar5;
  int *piVar6;
  bool bVar7;
  iterator __begin3;
  int *piVar8;
  ulong uVar9;
  int iVar10;
  int *piVar11;
  int iVar12;
  int i;
  ulong uVar13;
  
  uVar9 = 0xffffffffffffffff;
  iVar12 = 0;
  for (uVar13 = 0; (long)uVar13 < (long)this->n; uVar13 = uVar13 + 1) {
    if ((this->x).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar13] < 0) {
      fast_set::clear(&this->used);
      pvVar2 = (this->adj).
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      piVar3 = (this->x).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar4 = *(pointer *)
                ((long)&pvVar2[uVar13].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data + 8);
      piVar5 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar8 = pvVar2[uVar13].super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (piVar11 = piVar8; piVar11 != piVar4; piVar11 = piVar11 + 1) {
        if (piVar3[*piVar11] < 0) {
          piVar5[*piVar11] = (this->used).uid;
        }
      }
      iVar10 = 0;
      for (; piVar8 != piVar4; piVar8 = piVar8 + 1) {
        piVar6 = *(pointer *)
                  ((long)&pvVar2[*piVar8].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data + 8);
        piVar3 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        for (piVar11 = pvVar2[*piVar8].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start; piVar11 != piVar6; piVar11 = piVar11 + 1) {
          iVar1 = (this->used).uid;
          if (piVar3[*piVar11] != iVar1) {
            iVar10 = iVar10 + 1;
            piVar3[*piVar11] = iVar1;
          }
        }
      }
      iVar1 = iVar12;
      if (iVar12 < iVar10) {
        iVar1 = iVar10;
      }
      uVar9 = uVar9 & 0xffffffff;
      bVar7 = iVar12 < iVar10;
      iVar12 = iVar1;
      if (bVar7) {
        uVar9 = uVar13 & 0xffffffff;
      }
    }
  }
  return (int)uVar9;
}

Assistant:

int branch_and_reduce_algorithm::max_nh_vtx()
{
    int v = -1;
    int maxN2 = 0;

    for (int i = 0; i < n; i++)
    {
        if (x[i] < 0)
        {
            used.clear();
            for (int u : adj[i])
            {
                if (x[u] < 0)
                    used.add(u);
            }

            int cnt = 0;
            for (int u : adj[i])
            {
                for (int v : adj[u])
                {
                    if (!used.get(v))
                    {
                        cnt++;
                        used.add(v);
                    }
                }
            }

            if (cnt > maxN2)
            {
                v = i;
                maxN2 = cnt;
            }
        }
    }

    return v;
}